

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O2

void __thiscall test_matrix_sparse_at_Test::TestBody(test_matrix_sparse_at_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  DeathTest *pDVar1;
  ReturnSentinel RVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  char *pcVar6;
  _func_int **pp_Var7;
  DeathTest *pDVar8;
  ReturnSentinel RVar9;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> non_zero_00;
  DeathTest *gtest_dt;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var10;
  ReturnSentinel gtest_sentinel;
  Matrix_Sparse matrix_const;
  ReturnSentinel gtest_sentinel_3;
  size_t local_138;
  ReturnSentinel *local_130;
  undefined8 uStack_128;
  DeathTest **local_120;
  undefined8 uStack_118;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_110;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_f8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_e0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_b0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_98;
  Matrix_Sparse matrix_non_const;
  
  gtest_sentinel.test_ = (DeathTest *)0x0;
  matrix_const.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
  matrix_const.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000004;
  matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  matrix_const.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
  matrix_const.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_120 = &gtest_dt;
  gtest_dt = (DeathTest *)0x3ff0000000000000;
  _Var10._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4000000000000000;
  uStack_118 = 7;
  value._M_len = 7;
  value._M_array = (iterator)local_120;
  index._M_len = 7;
  index._M_array = (iterator)&matrix_const;
  non_zero._M_len = 5;
  non_zero._M_array = (iterator)&gtest_sentinel;
  Disa::Matrix_Sparse::Matrix_Sparse(&matrix_non_const,non_zero,index,value,5);
  gtest_dt = (DeathTest *)0x3;
  gtest_sentinel.test_ = (DeathTest *)&DAT_00000004;
  pdVar5 = Disa::Matrix_Sparse::at(&matrix_non_const,(size_t *)&gtest_dt,(size_t *)&gtest_sentinel);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_const,"matrix_non_const.at(3, 4)","6.0",*pdVar5,6.0);
  if ((char)matrix_const.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_dt);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*matrix_const.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x51,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (gtest_dt != (DeathTest *)0x0) {
      (*gtest_dt->_vptr_DeathTest[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
  gtest_dt = (DeathTest *)&DAT_00000004;
  pdVar5 = Disa::Matrix_Sparse::at(&matrix_non_const,(size_t *)&matrix_const,(size_t *)&gtest_dt);
  *pdVar5 = -10.0;
  gtest_dt = (DeathTest *)0x3;
  gtest_sentinel.test_ = (DeathTest *)&DAT_00000004;
  pdVar5 = Disa::Matrix_Sparse::at(&matrix_non_const,(size_t *)&gtest_dt,(size_t *)&gtest_sentinel);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_const,"matrix_non_const.at(3, 4)","-10.0",*pdVar5,-10.0);
  if ((char)matrix_const.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_dt);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*matrix_const.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x53,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (gtest_dt != (DeathTest *)0x0) {
      (*gtest_dt->_vptr_DeathTest[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)_Var10._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("double x = matrix_non_const.at(10, 4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_98,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x54,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_98);
    pDVar8 = gtest_dt;
    if (!bVar3) goto LAB_0010f922;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar4 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar4 == 0) {
        iVar4 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*pDVar8->_vptr_DeathTest[1])(pDVar8);
          goto LAB_0010f922;
        }
      }
      else if (iVar4 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          matrix_const.row_non_zero.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&DAT_0000000a;
          gtest_sentinel_3.test_ = (DeathTest *)&DAT_00000004;
          Disa::Matrix_Sparse::at
                    (&matrix_non_const,(size_t *)&matrix_const,(size_t *)&gtest_sentinel_3);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      pp_Var7 = pDVar8->_vptr_DeathTest;
      goto LAB_0010f97a;
    }
  }
  else {
LAB_0010f922:
    testing::Message::Message((Message *)&matrix_const);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x54,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&matrix_const);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      pp_Var7 = (_func_int **)
                *matrix_const.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pDVar8 = (DeathTest *)
               matrix_const.row_non_zero.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_0010f97a:
      (*pp_Var7[1])(pDVar8);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)_Var10._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("double x = matrix_non_const.at(0, 6)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_b0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x55,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_b0);
    pDVar8 = gtest_dt;
    if (!bVar3) goto LAB_0010fa86;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar4 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar4 == 0) {
        iVar4 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*pDVar8->_vptr_DeathTest[1])(pDVar8);
          goto LAB_0010fa86;
        }
      }
      else if (iVar4 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          matrix_const.row_non_zero.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          gtest_sentinel_3.test_ = (DeathTest *)&DAT_00000006;
          Disa::Matrix_Sparse::at
                    (&matrix_non_const,(size_t *)&matrix_const,(size_t *)&gtest_sentinel_3);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      pp_Var7 = pDVar8->_vptr_DeathTest;
      goto LAB_0010fade;
    }
  }
  else {
LAB_0010fa86:
    testing::Message::Message((Message *)&matrix_const);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x55,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&matrix_const);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      pp_Var7 = (_func_int **)
                *matrix_const.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pDVar8 = (DeathTest *)
               matrix_const.row_non_zero.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_0010fade:
      (*pp_Var7[1])(pDVar8);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)_Var10._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("double x = matrix_non_const.at(10, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x56,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c8);
    pDVar8 = gtest_dt;
    if (!bVar3) goto LAB_0010fbed;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar4 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar4 == 0) {
        iVar4 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*pDVar8->_vptr_DeathTest[1])(pDVar8);
          goto LAB_0010fbed;
        }
      }
      else if (iVar4 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          matrix_const.row_non_zero.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&DAT_0000000a;
          gtest_sentinel_3.test_ = (DeathTest *)0x2;
          Disa::Matrix_Sparse::at
                    (&matrix_non_const,(size_t *)&matrix_const,(size_t *)&gtest_sentinel_3);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      pp_Var7 = pDVar8->_vptr_DeathTest;
      goto LAB_0010fc45;
    }
  }
  else {
LAB_0010fbed:
    testing::Message::Message((Message *)&matrix_const);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x56,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&matrix_const);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      pp_Var7 = (_func_int **)
                *matrix_const.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pDVar8 = (DeathTest *)
               matrix_const.row_non_zero.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_0010fc45:
      (*pp_Var7[1])(pDVar8);
    }
  }
  gtest_sentinel_3.test_ = (DeathTest *)0x0;
  gtest_dt = (DeathTest *)0x1;
  _Var10._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  gtest_sentinel.test_ = (DeathTest *)0x3ff0000000000000;
  uStack_128 = 7;
  value_00._M_len = 7;
  value_00._M_array = (iterator)&gtest_sentinel;
  index_00._M_len = 7;
  index_00._M_array = (iterator)&gtest_dt;
  non_zero_00._M_len = 5;
  non_zero_00._M_array = (iterator)&gtest_sentinel_3;
  local_130 = &gtest_sentinel;
  Disa::Matrix_Sparse::Matrix_Sparse(&matrix_const,non_zero_00,index_00,value_00,5);
  gtest_sentinel.test_ = (DeathTest *)0x3;
  gtest_sentinel_3.test_ = (DeathTest *)&DAT_00000004;
  pdVar5 = Disa::Matrix_Sparse::at
                     (&matrix_const,(size_t *)&gtest_sentinel,(size_t *)&gtest_sentinel_3);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_dt,"matrix_const.at(3, 4)","6.0",*pdVar5,6.0);
  if ((char)gtest_dt == '\0') {
    testing::Message::Message((Message *)&gtest_sentinel);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var10._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)_Var10._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x59,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_sentinel_3,(Message *)&gtest_sentinel);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel_3);
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      (*(gtest_sentinel.test_)->_vptr_DeathTest[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffffdd0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)_Var10._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("double x = matrix_const.at(10, 4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_e0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x5a,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_e0);
    RVar9 = gtest_sentinel;
    if (!bVar3) goto LAB_0010feca;
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar2 = gtest_sentinel;
      if (iVar4 == 0) {
        iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*(RVar2.test_)->_vptr_DeathTest[4])(RVar2.test_,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*(RVar9.test_)->_vptr_DeathTest[1])(RVar9.test_);
          goto LAB_0010feca;
        }
      }
      else if (iVar4 == 1) {
        gtest_sentinel_3 = gtest_sentinel;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          gtest_dt = (DeathTest *)&DAT_0000000a;
          local_138 = 4;
          Disa::Matrix_Sparse::at(&matrix_const,(size_t *)&gtest_dt,&local_138);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel_3);
      }
      pp_Var7 = (RVar9.test_)->_vptr_DeathTest;
      goto LAB_0010ff19;
    }
  }
  else {
LAB_0010feca:
    testing::Message::Message((Message *)&gtest_dt);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x5a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (gtest_dt != (DeathTest *)0x0) {
      pp_Var7 = gtest_dt->_vptr_DeathTest;
      RVar9.test_ = gtest_dt;
LAB_0010ff19:
      (*pp_Var7[1])(RVar9.test_);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)_Var10._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("double x = matrix_const.at(0, 6)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_f8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x5b,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_f8);
    RVar9 = gtest_sentinel;
    if (!bVar3) goto LAB_00110025;
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar2 = gtest_sentinel;
      if (iVar4 == 0) {
        iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*(RVar2.test_)->_vptr_DeathTest[4])(RVar2.test_,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*(RVar9.test_)->_vptr_DeathTest[1])(RVar9.test_);
          goto LAB_00110025;
        }
      }
      else if (iVar4 == 1) {
        gtest_sentinel_3 = gtest_sentinel;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          gtest_dt = (DeathTest *)0x0;
          local_138 = 6;
          Disa::Matrix_Sparse::at(&matrix_const,(size_t *)&gtest_dt,&local_138);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel_3);
      }
      pp_Var7 = (RVar9.test_)->_vptr_DeathTest;
      goto LAB_00110074;
    }
  }
  else {
LAB_00110025:
    testing::Message::Message((Message *)&gtest_dt);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x5b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (gtest_dt != (DeathTest *)0x0) {
      pp_Var7 = gtest_dt->_vptr_DeathTest;
      RVar9.test_ = gtest_dt;
LAB_00110074:
      (*pp_Var7[1])(RVar9.test_);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)_Var10._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("double x = matrix_const.at(10, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_110,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x5c,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_110);
    RVar9 = gtest_sentinel;
    if (!bVar3) goto LAB_00110187;
    if (gtest_sentinel.test_ == (DeathTest *)0x0) goto LAB_001101d9;
    iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
    RVar2 = gtest_sentinel;
    if (iVar4 == 0) {
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
      bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
      iVar4 = (*(RVar2.test_)->_vptr_DeathTest[4])(RVar2.test_,(ulong)bVar3);
      if ((char)iVar4 == '\0') {
        (*(RVar9.test_)->_vptr_DeathTest[1])(RVar9.test_);
        goto LAB_00110187;
      }
    }
    else if (iVar4 == 1) {
      gtest_sentinel_3 = gtest_sentinel;
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        gtest_dt = (DeathTest *)&DAT_0000000a;
        local_138 = 2;
        Disa::Matrix_Sparse::at(&matrix_const,(size_t *)&gtest_dt,&local_138);
      }
      (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel_3);
    }
    pp_Var7 = (RVar9.test_)->_vptr_DeathTest;
  }
  else {
LAB_00110187:
    testing::Message::Message((Message *)&gtest_dt);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x5c,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (gtest_dt == (DeathTest *)0x0) goto LAB_001101d9;
    pp_Var7 = gtest_dt->_vptr_DeathTest;
    RVar9.test_ = gtest_dt;
  }
  (*pp_Var7[1])(RVar9.test_);
LAB_001101d9:
  Disa::Matrix_Sparse::~Matrix_Sparse(&matrix_const);
  Disa::Matrix_Sparse::~Matrix_Sparse(&matrix_non_const);
  return;
}

Assistant:

TEST(test_matrix_sparse, at) {
  Matrix_Sparse matrix_non_const({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  EXPECT_DOUBLE_EQ(matrix_non_const.at(3, 4), 6.0);
  matrix_non_const.at(3, 4) = -10.0;
  EXPECT_DOUBLE_EQ(matrix_non_const.at(3, 4), -10.0);
  EXPECT_DEATH(double x = matrix_non_const.at(10, 4), "./*");
  EXPECT_DEATH(double x = matrix_non_const.at(0, 6), "./*");
  EXPECT_DEATH(double x = matrix_non_const.at(10, 2), "./*");

  const Matrix_Sparse matrix_const({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  EXPECT_DOUBLE_EQ(matrix_const.at(3, 4), 6.0);
  EXPECT_DEATH(double x = matrix_const.at(10, 4), "./*");
  EXPECT_DEATH(double x = matrix_const.at(0, 6), "./*");
  EXPECT_DEATH(double x = matrix_const.at(10, 2), "./*");
}